

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AutoCloseFd> __thiscall
kj::AsyncCapabilityStream::receiveFd(AsyncCapabilityStream *this)

{
  PromiseNode *extraout_RDX;
  long *in_RSI;
  Promise<kj::AutoCloseFd> PVar1;
  PropagateException local_29;
  Promise<kj::Maybe<kj::AutoCloseFd>_> local_28;
  AsyncCapabilityStream *this_local;
  
  this_local = this;
  (**(code **)(*in_RSI + 0x60))();
  Promise<kj::Maybe<kj::AutoCloseFd>>::
  then<kj::AsyncCapabilityStream::receiveFd()::__0,kj::_::PropagateException>
            ((Promise<kj::Maybe<kj::AutoCloseFd>> *)this,(Type *)&local_28,&local_29);
  Promise<kj::Maybe<kj::AutoCloseFd>_>::~Promise(&local_28);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::AutoCloseFd>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<AutoCloseFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<AutoCloseFd>&& result) -> Promise<AutoCloseFd> {
    KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}